

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::integer_parser<unsigned_short>(string *text,unsigned_short *value)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  size_type sVar6;
  IntegerDesc int_desc;
  
  parser_tool::SplitInteger(&int_desc,text);
  sVar2 = 10;
  if (int_desc.base._M_string_length != 0) {
    sVar2 = 0x10;
  }
  uVar5 = 0;
  for (sVar6 = 0; int_desc.value._M_string_length != sVar6; sVar6 = sVar6 + 1) {
    bVar1 = int_desc.value._M_dataplus._M_p[sVar6];
    uVar4 = (ushort)bVar1;
    if ((byte)(bVar1 - 0x30) < 10) {
      sVar3 = uVar4 - 0x30;
    }
    else if ((int_desc.base._M_string_length == 0) || (5 < (byte)(bVar1 + 0x9f))) {
      if ((int_desc.base._M_string_length == 0) || (5 < (byte)(bVar1 + 0xbf))) {
        throw_or_mimic<cxxopts::argument_incorrect_type>(text);
        sVar3 = 0;
      }
      else {
        sVar3 = uVar4 - 0x37;
      }
    }
    else {
      sVar3 = uVar4 - 0x57;
    }
    uVar4 = sVar3 + uVar5 * sVar2;
    if (uVar4 < uVar5) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(text);
    }
    uVar5 = uVar4;
  }
  if (int_desc.negative._M_string_length == 0) {
    *value = uVar5;
  }
  else {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text);
  }
  parser_tool::IntegerDesc::~IntegerDesc(&int_desc);
  return;
}

Assistant:

void
    integer_parser(const std::string& text, T& value)
    {
      parser_tool::IntegerDesc int_desc = parser_tool::SplitInteger(text);

      using US = typename std::make_unsigned<T>::type;
      constexpr bool is_signed = std::numeric_limits<T>::is_signed;

      const bool          negative    = int_desc.negative.length() > 0;
      const uint8_t       base        = int_desc.base.length() > 0 ? 16 : 10;
      const std::string & value_match = int_desc.value;

      US result = 0;

      for (char ch : value_match)
      {
        US digit = 0;

        if (ch >= '0' && ch <= '9')
        {
          digit = static_cast<US>(ch - '0');
        }
        else if (base == 16 && ch >= 'a' && ch <= 'f')
        {
          digit = static_cast<US>(ch - 'a' + 10);
        }
        else if (base == 16 && ch >= 'A' && ch <= 'F')
        {
          digit = static_cast<US>(ch - 'A' + 10);
        }
        else
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        const US next = static_cast<US>(result * base + digit);
        if (result > next)
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        result = next;
      }

      detail::check_signed_range<T>(negative, result, text);

      if (negative)
      {
        checked_negate<T>(value, result, text, std::integral_constant<bool, is_signed>());
      }
      else
      {
        value = static_cast<T>(result);
      }
    }